

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

ctrl_t * phmap::priv::EmptyGroup<std::is_same<phmap::priv::Alloc<int>,std::allocator<int>>>(void)

{
  return (ctrl_t *)0x0;
}

Assistant:

inline ctrl_t* EmptyGroup() {
  PHMAP_IF_CONSTEXPR (std_alloc_t::value) {
      alignas(16) static constexpr ctrl_t empty_group[] = {
          kSentinel, kEmpty, kEmpty, kEmpty, kEmpty, kEmpty, kEmpty, kEmpty,
          kEmpty,    kEmpty, kEmpty, kEmpty, kEmpty, kEmpty, kEmpty, kEmpty};

      return const_cast<ctrl_t*>(empty_group);
  } else {
       return nullptr;
  }
}